

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O2

void av1_idct4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  long lVar9;
  int iVar10;
  int32_t step [4];
  
  lVar9 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[2];
  output[2] = input[1];
  output[3] = input[3];
  av1_range_check_buf(1,input,output,4,stage_range[1]);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1e0);
  iVar10 = output[1] * iVar1;
  lVar7 = 1L << (cos_bit - 1U & 0x3f);
  lVar8 = (long)*output * (long)iVar1 + lVar7;
  step[0] = (int32_t)(lVar8 + iVar10 >> (cos_bit & 0x3fU));
  step[1] = (int32_t)(-iVar10 + lVar8 >> (cos_bit & 0x3fU));
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x1a0);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar9 + 0x220);
  step[2] = (int32_t)(output[2] * iVar10 + lVar7 + (long)-(iVar1 * output[3]) >> (cos_bit & 0x3fU));
  step[3] = (int32_t)(iVar1 * output[2] + lVar7 + (long)(output[3] * iVar10) >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,step,4,stage_range[2]);
  iVar3 = step[3];
  iVar6 = step[0];
  iVar4 = clamp_value(step[0] + step[3],stage_range[3]);
  iVar2 = step[2];
  iVar5 = step[1];
  *output = iVar4;
  iVar4 = clamp_value(step[1] + step[2],stage_range[3]);
  output[1] = iVar4;
  iVar5 = clamp_value(iVar5 - iVar2,stage_range[3]);
  output[2] = iVar5;
  iVar6 = clamp_value(iVar6 - iVar3,stage_range[3]);
  output[3] = iVar6;
  return;
}

Assistant:

void av1_idct4(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 4;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[4];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[2];
  bf1[2] = input[1];
  bf1[3] = input[3];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
}